

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmBannerManager::flush_all(CVmBannerManager *this,vm_nl_type nl)

{
  CVmConsole *this_00;
  ulong uVar1;
  
  if ((this->super_CVmHandleManager).handles_max_ != 0) {
    uVar1 = 0;
    do {
      this_00 = (CVmConsole *)(this->super_CVmHandleManager).handles_[uVar1];
      if (this_00 != (CVmConsole *)0x0) {
        CVmConsole::flush(this_00,nl);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->super_CVmHandleManager).handles_max_);
  }
  return;
}

Assistant:

void CVmBannerManager::flush_all(VMG_ vm_nl_type nl)
{
    size_t slot;

    /* flush each banner */
    for (slot = 0 ; slot < handles_max_ ; ++slot)
    {
        /* if this slot has a valid banner, flush it */
        if (handles_[slot] != 0)
            ((CVmConsoleBanner *)handles_[slot])->flush(vmg_ nl);
    }
}